

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

void __thiscall Mustache::Renderer::setError(Renderer *this,QString *error,int pos)

{
  Data *pDVar1;
  pointer pQVar2;
  
  QString::operator=(&this->m_error,(QString *)error);
  this->m_errorPos = pos;
  if ((this->m_partialStack).super_QList<QString>.d.size != 0) {
    pDVar1 = (this->m_partialStack).super_QList<QString>.d.d;
    if ((pDVar1 == (Data *)0x0) || (1 < (int)(pDVar1->super_QArrayData).ref_._q_value)) {
      QArrayDataPointer<QString>::reallocateAndGrow
                ((QArrayDataPointer<QString> *)this,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
    }
    pQVar2 = QList<QString>::data((QList<QString> *)this);
    QString::operator=(&this->m_errorPartial,
                       (QString *)(pQVar2 + (this->m_partialStack).super_QList<QString>.d.size + -1)
                      );
    return;
  }
  return;
}

Assistant:

void Renderer::setError(const QString& error, int pos)
{
	Q_ASSERT(!error.isEmpty());
	Q_ASSERT(pos >= 0);

	m_error = error;
	m_errorPos = pos;

	if (!m_partialStack.isEmpty())
	{
		m_errorPartial = m_partialStack.top();
	}
}